

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plf_stack.h
# Opt level: O2

void __thiscall
plf::stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_>::initialize
          (stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_> *this)

{
  element_pointer_type pMVar1;
  group *__p;
  
  __p = (group *)operator_new(0x20);
  this->current_group = __p;
  this->first_group = __p;
  __gnu_cxx::
  new_allocator<plf::stack<MatchingStateDebugFailures,std::allocator<MatchingStateDebugFailures>>::group>
  ::
  construct<plf::stack<MatchingStateDebugFailures,std::allocator<MatchingStateDebugFailures>>::group,unsigned_long&>
            ((new_allocator<plf::stack<MatchingStateDebugFailures,std::allocator<MatchingStateDebugFailures>>::group>
              *)&this->group_allocator_pair,__p,&this->min_block_capacity);
  pMVar1 = this->first_group->elements;
  this->start_element = pMVar1;
  this->top_element = pMVar1;
  this->end_element = this->first_group->end;
  return;
}

Assistant:

void initialize()
	{
		first_group = current_group = PLF_ALLOCATE(group_allocator_type, group_allocator_pair, 1, 0);

		// Initialize:
		try
		{
			#ifdef PLF_VARIADICS_SUPPORT
				PLF_CONSTRUCT(group_allocator_type, group_allocator_pair, first_group, min_block_capacity);
			#else
				PLF_CONSTRUCT(group_allocator_type, group_allocator_pair, first_group, group(min_block_capacity));
			#endif
		}
		catch (...)
		{
			PLF_DEALLOCATE(group_allocator_type, group_allocator_pair, first_group, 1);
			first_group = current_group = NULL;
			throw;
		}

		top_element = start_element = first_group->elements;
		end_element = first_group->end;
	}